

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Matcher::MatchSingleCharCaseInsensitive
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,Char c)

{
  uint64 *puVar1;
  Type TVar2;
  MappingSource mappingSource;
  bool bVar3;
  GroupInfo *pGVar4;
  
  TVar2 = ((this->program).ptr)->flags;
  mappingSource = TVar2 >> 3 & CaseFolding;
  if ((TVar2 & StickyRegexFlag) == NoRegexFlags) {
    for (; offset < inputLength; offset = offset + 1) {
      if (this->stats != (Type)0x0) {
        puVar1 = &this->stats->numCompares;
        *puVar1 = *puVar1 + 1;
      }
      bVar3 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
      if (bVar3) goto LAB_00d45bab;
    }
  }
  else {
    if (this->stats != (Type)0x0) {
      puVar1 = &this->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    bVar3 = MatchSingleCharCaseInsensitiveHere(this,mappingSource,input,offset,c);
    if (bVar3) {
LAB_00d45bab:
      pGVar4 = GroupIdToGroupInfo(this,0);
      pGVar4->offset = offset;
      pGVar4->length = 1;
      return true;
    }
  }
  ResetGroup(this,0);
  return false;
}

Assistant:

inline bool Matcher::MatchSingleCharCaseInsensitive(const Char* const input, const CharCount inputLength, CharCount offset, const Char c)
    {
        CaseInsensitive::MappingSource mappingSource = program->GetCaseMappingSource();

        // If sticky flag is present, break since the 1st character didn't match the pattern character
        if ((program->flags & StickyRegexFlag) != 0)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            else
            {
                ResetGroup(0);
                return false;
            }
        }

        while (offset < inputLength)
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            CompStats();
#endif
            if (MatchSingleCharCaseInsensitiveHere(mappingSource, input, offset, c))
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = offset;
                info->length = 1;
                return true;
            }
            offset++;
        }

        ResetGroup(0);
        return false;
    }